

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

float __thiscall wasm::Random::getFloat(Random *this)

{
  int32_t init;
  float fVar1;
  Literal local_28;
  Random *local_10;
  Random *this_local;
  
  local_10 = this;
  init = get32(this);
  Literal::Literal(&local_28,init);
  fVar1 = Literal::reinterpretf32(&local_28);
  wasm::Literal::~Literal(&local_28);
  return fVar1;
}

Assistant:

float Random::getFloat() { return Literal(get32()).reinterpretf32(); }